

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_source_content_sb(AV1_COMP *cpi,MACROBLOCK *x,TileDataEnc *tile_data,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  byte bVar6;
  int16_t iVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  SOURCE_SAD SVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *puVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint8_t *puVar22;
  bool bVar23;
  int shift_y [2];
  int shift_x [2];
  uint tmp_sse;
  int local_68 [2];
  byte local_60 [4];
  int local_5c;
  ulong local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  TileDataEnc *local_40;
  uint local_34;
  
  pYVar4 = cpi->source;
  pYVar5 = cpi->last_source;
  if ((((pYVar5->field_0).field_0.y_width == (pYVar4->field_0).field_0.y_width) &&
      ((pYVar5->field_1).field_0.y_height == (pYVar4->field_1).field_0.y_height)) &&
     ((((x->e_mbd).cur_buf)->flags & 8) == 0)) {
    local_58 = (ulong)((cpi->common).seq_params)->sb_size;
    iVar12 = (pYVar4->field_4).field_0.y_stride;
    iVar3 = (pYVar5->field_4).field_0.y_stride;
    bVar23 = (cpi->sf).rt_sf.increase_source_sad_thresh == 0;
    uVar10 = 2000000;
    if (bVar23) {
      uVar10 = 1000000;
    }
    uVar21 = 200000;
    if (bVar23) {
      uVar21 = 100000;
    }
    uVar18 = 20000;
    if (bVar23) {
      uVar18 = 10000;
    }
    local_48 = (pYVar4->field_5).buffers[0] + (iVar12 * mi_row * 4 + mi_col * 4);
    local_50 = (pYVar5->field_5).buffers[0] + (mi_row * 4 * iVar3 + mi_col * 4);
    local_40 = tile_data;
    uVar9 = (*cpi->ppi->fn_ptr[local_58].vf)(local_48,iVar12,local_50,iVar3,&local_34);
    if ((local_34 < 36000) && ((x->content_state_sb).source_sad_rd = kLowSad, local_34 == 0)) {
      (x->content_state_sb).source_sad_nonrd = kZeroSad;
    }
    else {
      SVar13 = kVeryLowSad;
      if ((local_34 < uVar18) ||
         ((SVar13 = kLowSad, local_34 < uVar21 || (SVar13 = kHighSad, uVar10 < local_34)))) {
        (x->content_state_sb).source_sad_nonrd = SVar13;
      }
      uVar21 = local_34 - uVar9;
      if ((uVar9 < local_34 >> 1) && (10000 < uVar21)) {
        (x->content_state_sb).lighting_change = 1;
      }
      else if (uVar21 < 5000) {
        (x->content_state_sb).low_sumdiff = 1;
      }
      if (((uVar10 * 7 >> 3 < local_34) && ((x->content_state_sb).lighting_change == 0)) &&
         ((x->content_state_sb).low_sumdiff == 0)) {
        x->sb_force_fixed_part = 0;
      }
      if ((((cpi->sf).rt_sf.use_rtc_tf != 0) && ((cpi->rc).high_source_sad == 0)) &&
         (((cpi->rc).frame_source_sad < 0x4e21 && ((cpi->svc).number_spatial_layers < 2)))) {
        iVar7 = av1_ac_quant_QTX((cpi->common).quant_params.base_qindex,0,
                                 ((cpi->common).seq_params)->bit_depth);
        uVar8 = av1_ac_quant_QTX((cpi->ppi->p_rc).avg_frame_qindex[1],0,
                                 ((cpi->common).seq_params)->bit_depth);
        if ((cpi->sf).rt_sf.use_rtc_tf == 1) {
          uVar10 = (int)(short)uVar8;
          if (999 < uVar8) {
            uVar10 = 1000;
          }
          if ((short)uVar8 < 0xfa) {
            uVar10 = 0xfa;
          }
          uVar10 = (uVar10 & 0xffff) * (int)iVar7;
        }
        else {
          uVar10 = iVar7 * 0xfa;
        }
        if (((uVar21 < 0x10) && (uVar9 <= uVar10)) &&
           ((iVar11 = (cpi->common).mi_params.mi_stride,
            iVar11 = check_neighbor_blocks
                               ((cpi->common).mi_params.mi_grid_base + (iVar11 * mi_row + mi_col),
                                iVar11,&local_40->tile_info,mi_row,mi_col), iVar11 != 0 &&
            (iVar12 = fast_detect_non_zero_motion(cpi,local_48,iVar12,local_50,iVar3,mi_row,mi_col),
            iVar12 != 0)))) {
          local_60[0] = 0;
          local_60[1] = 0;
          local_60[2] = 0;
          local_60[3] = 0;
          local_5c = cpi->source->subsampling_x;
          local_68[0] = 0;
          local_68[1] = cpi->source->subsampling_y;
          bVar1 = block_size_high[local_58];
          bVar2 = block_size_wide[local_58];
          uVar15 = 0;
          do {
            bVar6 = bVar1 >> ((byte)local_68[uVar15 != 0] & 0x1f);
            if (bVar6 != 0) {
              iVar11 = mi_row << (2 - (byte)local_68[uVar15 != 0] & 0x1f);
              lVar17 = (ulong)(uVar15 != 0) * 4;
              iVar12 = *(int *)((long)cpi->last_source->store_buf_adr + lVar17 + -0x28);
              iVar19 = mi_col << (2 - local_60[lVar17] & 0x1f);
              puVar16 = cpi->last_source->store_buf_adr[uVar15 - 4] + (iVar12 * iVar11 + iVar19);
              iVar3 = *(int *)((long)cpi->source->store_buf_adr + lVar17 + -0x28);
              puVar22 = cpi->source->store_buf_adr[uVar15 - 4] + (iVar3 * iVar11 + iVar19);
              uVar20 = (ulong)(bVar2 >> (local_60[lVar17] & 0x1f));
              uVar10 = 0;
              do {
                if (uVar20 != 0) {
                  uVar14 = 0;
                  do {
                    puVar22[uVar14] = (uint8_t)((uint)puVar22[uVar14] + (uint)puVar16[uVar14] >> 1);
                    uVar14 = uVar14 + 1;
                  } while (uVar20 != uVar14);
                }
                puVar22 = puVar22 + iVar3;
                puVar16 = puVar16 + iVar12;
                uVar10 = uVar10 + 1;
              } while (uVar10 != bVar6);
            }
          } while ((((cpi->common).seq_params)->monochrome == '\0') &&
                  (bVar23 = uVar15 < 2, uVar15 = uVar15 + 1, bVar23));
        }
      }
    }
  }
  return;
}

Assistant:

void av1_source_content_sb(AV1_COMP *cpi, MACROBLOCK *x, TileDataEnc *tile_data,
                           int mi_row, int mi_col) {
  if (cpi->last_source->y_width != cpi->source->y_width ||
      cpi->last_source->y_height != cpi->source->y_height)
    return;
#if CONFIG_AV1_HIGHBITDEPTH
  if (x->e_mbd.cur_buf->flags & YV12_FLAG_HIGHBITDEPTH) return;
#endif

  unsigned int tmp_sse;
  unsigned int tmp_variance;
  const BLOCK_SIZE bsize = cpi->common.seq_params->sb_size;
  uint8_t *src_y = cpi->source->y_buffer;
  const int src_ystride = cpi->source->y_stride;
  const int src_offset = src_ystride * (mi_row << 2) + (mi_col << 2);
  uint8_t *last_src_y = cpi->last_source->y_buffer;
  const int last_src_ystride = cpi->last_source->y_stride;
  const int last_src_offset = last_src_ystride * (mi_row << 2) + (mi_col << 2);
  uint64_t avg_source_sse_threshold_verylow = 10000;     // ~1.5*1.5*(64*64)
  uint64_t avg_source_sse_threshold_low[2] = { 100000,   // ~5*5*(64*64)
                                               36000 };  // ~3*3*(64*64)

  uint64_t avg_source_sse_threshold_high = 1000000;  // ~15*15*(64*64)
  if (cpi->sf.rt_sf.increase_source_sad_thresh) {
    avg_source_sse_threshold_high = avg_source_sse_threshold_high << 1;
    avg_source_sse_threshold_low[0] = avg_source_sse_threshold_low[0] << 1;
    avg_source_sse_threshold_verylow = avg_source_sse_threshold_verylow << 1;
  }
  uint64_t sum_sq_thresh = 10000;  // sum = sqrt(thresh / 64*64)) ~1.5
  src_y += src_offset;
  last_src_y += last_src_offset;
  tmp_variance = cpi->ppi->fn_ptr[bsize].vf(src_y, src_ystride, last_src_y,
                                            last_src_ystride, &tmp_sse);
  // rd thresholds
  if (tmp_sse < avg_source_sse_threshold_low[1])
    x->content_state_sb.source_sad_rd = kLowSad;

  // nonrd thresholds
  if (tmp_sse == 0) {
    x->content_state_sb.source_sad_nonrd = kZeroSad;
    return;
  }
  if (tmp_sse < avg_source_sse_threshold_verylow)
    x->content_state_sb.source_sad_nonrd = kVeryLowSad;
  else if (tmp_sse < avg_source_sse_threshold_low[0])
    x->content_state_sb.source_sad_nonrd = kLowSad;
  else if (tmp_sse > avg_source_sse_threshold_high)
    x->content_state_sb.source_sad_nonrd = kHighSad;

  // Detect large lighting change.
  // Note: tmp_sse - tmp_variance = ((sum * sum) >> 12)
  if (tmp_variance < (tmp_sse >> 1) && (tmp_sse - tmp_variance) > sum_sq_thresh)
    x->content_state_sb.lighting_change = 1;
  if ((tmp_sse - tmp_variance) < (sum_sq_thresh >> 1))
    x->content_state_sb.low_sumdiff = 1;

  if (tmp_sse > ((avg_source_sse_threshold_high * 7) >> 3) &&
      !x->content_state_sb.lighting_change && !x->content_state_sb.low_sumdiff)
    x->sb_force_fixed_part = 0;

  if (!cpi->sf.rt_sf.use_rtc_tf || cpi->rc.high_source_sad ||
      cpi->rc.frame_source_sad > 20000 || cpi->svc.number_spatial_layers > 1)
    return;

  // In-place temporal filter. If psnr calculation is enabled, we store the
  // source for that.
  AV1_COMMON *const cm = &cpi->common;
  // Calculate n*mean^2
  const unsigned int nmean2 = tmp_sse - tmp_variance;
  const int ac_q_step = av1_ac_quant_QTX(cm->quant_params.base_qindex, 0,
                                         cm->seq_params->bit_depth);
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const int avg_q_step = av1_ac_quant_QTX(p_rc->avg_frame_qindex[INTER_FRAME],
                                          0, cm->seq_params->bit_depth);

  const unsigned int threshold =
      (cpi->sf.rt_sf.use_rtc_tf == 1)
          ? (clamp(avg_q_step, 250, 1000)) * ac_q_step
          : 250 * ac_q_step;

  // TODO(yunqing): use a weighted sum instead of averaging in filtering.
  if (tmp_variance <= threshold && nmean2 <= 15) {
    // Check neighbor blocks. If neighbor blocks aren't low-motion blocks,
    // skip temporal filtering for this block.
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    const TileInfo *const tile_info = &tile_data->tile_info;
    const int is_neighbor_blocks_low_motion = check_neighbor_blocks(
        mi, cm->mi_params.mi_stride, tile_info, mi_row, mi_col);
    if (!is_neighbor_blocks_low_motion) return;

    // Only consider 64x64 SB for now. Need to extend to 128x128 for large SB
    // size.
    // Test several nearby points. If non-zero mv exists, don't do temporal
    // filtering.
    const int is_this_blk_low_motion = fast_detect_non_zero_motion(
        cpi, src_y, src_ystride, last_src_y, last_src_ystride, mi_row, mi_col);

    if (!is_this_blk_low_motion) return;

    const int shift_x[2] = { 0, cpi->source->subsampling_x };
    const int shift_y[2] = { 0, cpi->source->subsampling_y };
    const uint8_t h = block_size_high[bsize];
    const uint8_t w = block_size_wide[bsize];

    for (int plane = 0; plane < av1_num_planes(cm); ++plane) {
      uint8_t *src = cpi->source->buffers[plane];
      const int src_stride = cpi->source->strides[plane != 0];
      uint8_t *last_src = cpi->last_source->buffers[plane];
      const int last_src_stride = cpi->last_source->strides[plane != 0];
      src += src_stride * (mi_row << (2 - shift_y[plane != 0])) +
             (mi_col << (2 - shift_x[plane != 0]));
      last_src += last_src_stride * (mi_row << (2 - shift_y[plane != 0])) +
                  (mi_col << (2 - shift_x[plane != 0]));

      for (int i = 0; i < (h >> shift_y[plane != 0]); ++i) {
        for (int j = 0; j < (w >> shift_x[plane != 0]); ++j) {
          src[j] = (last_src[j] + src[j]) >> 1;
        }
        src += src_stride;
        last_src += last_src_stride;
      }
    }
  }
}